

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,
          offset_in_MessageGenerator_to_subr pfn)

{
  long *plVar1;
  ZeroCopyOutputStream *pZVar2;
  long *plVar3;
  size_type *psVar4;
  AnnotationCollector *pAVar5;
  undefined7 in_stack_00000009;
  long *local_160;
  Printer printer;
  long local_150;
  long lStack_148;
  undefined1 local_c0 [8];
  GeneratedCodeInfo annotations;
  char local_b0 [32];
  AnnotationCollector local_90;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string info_full_path;
  undefined1 local_50 [8];
  string filename;
  
  info_full_path.field_2._8_8_ = package_dir;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (java_package->_M_dataplus)._M_p);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_c0,
                              (ulong)(annotation_list->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_150 = *plVar3;
    lStack_148 = plVar1[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *plVar3;
    local_160 = (long *)*plVar1;
  }
  _printer = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_50 = (undefined1  [8])&filename._M_string_length;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar4) {
    filename._M_string_length = *psVar4;
    filename.field_2._M_allocated_capacity = plVar1[3];
  }
  else {
    filename._M_string_length = *psVar4;
    local_50 = (undefined1  [8])*plVar1;
  }
  filename._M_dataplus._M_p = (pointer)plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_c0 != (undefined1  [8])local_b0) {
    operator_delete((void *)local_c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,(value_type *)local_50);
  annotation_collector.annotation_proto_ = (GeneratedCodeInfo *)&info_full_path._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&annotation_collector.annotation_proto_,local_50,
             filename._M_dataplus._M_p + (long)local_50);
  std::__cxx11::string::append((char *)&annotation_collector.annotation_proto_);
  google::protobuf::GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_c0,(Arena *)0x0)
  ;
  local_90._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00313328;
  annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector = (_func_int **)local_c0;
  pZVar2 = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_50);
  pAVar5 = &local_90;
  if ((char)file_list == '\0') {
    pAVar5 = (AnnotationCollector *)0x0;
  }
  google::protobuf::io::Printer::Printer((Printer *)&local_160,pZVar2,'$',pAVar5);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)&local_160,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             **(undefined8 **)&java_package->field_2);
  if (*(long *)(info_full_path.field_2._8_8_ + 8) != 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              ((Printer *)&local_160,"package $package$;\n\n",(char (*) [8])0x2ad550,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               info_full_path.field_2._8_8_);
  }
  plVar1 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (((ulong)generator & 1) != 0) {
    generator = *(MessageGenerator **)(*plVar1 + -1 + (long)generator);
  }
  (*(code *)generator)(plVar1,&local_160);
  if ((char)file_list != '\0') {
    plVar1 = (long *)(**(code **)(*(long *)descriptor + 0x10))
                               (descriptor,&annotation_collector.annotation_proto_);
    google::protobuf::MessageLite::SerializeToZeroCopyStream((ZeroCopyOutputStream *)local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),
                (value_type *)&annotation_collector.annotation_proto_);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))(plVar1);
    }
  }
  google::protobuf::io::Printer::~Printer((Printer *)&local_160);
  if (pZVar2 != (ZeroCopyOutputStream *)0x0) {
    (**(code **)(*(long *)pZVar2 + 8))(pZVar2);
  }
  google::protobuf::GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_c0);
  if (annotation_collector.annotation_proto_ !=
      (GeneratedCodeInfo *)&info_full_path._M_string_length) {
    operator_delete(annotation_collector.annotation_proto_);
  }
  if (local_50 != (undefined1  [8])&filename._M_string_length) {
    operator_delete((void *)local_50);
  }
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  std::string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}